

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesture.cpp
# Opt level: O1

QDebug operator<<(QDebug d,QGestureEvent *gestureEvent)

{
  QTextStream *this;
  undefined8 uVar1;
  long in_RDX;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QDebugStateSaver saver;
  QDebug local_68;
  QDebug local_60;
  undefined1 *local_58;
  QList<QGesture_*> local_50;
  long local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_58,(QDebug *)gestureEvent);
  this = *(QTextStream **)gestureEvent;
  this[0x30] = (QTextStream)0x0;
  QVar2.m_data = (storage_type *)0xe;
  QVar2.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar2);
  QTextStream::operator<<(this,(QString *)&local_50);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((*(QTextStream **)gestureEvent)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)gestureEvent,' ');
  }
  local_38 = *(long *)gestureEvent;
  *(int *)(local_38 + 0x28) = *(int *)(local_38 + 0x28) + 1;
  local_50.d.d = *(Data **)(in_RDX + 0x10);
  local_50.d.ptr = *(QGesture ***)(in_RDX + 0x18);
  local_50.d.size = *(qsizetype *)(in_RDX + 0x20);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_68.stream = (Stream *)0x0;
  QtPrivate::printSequentialContainer<QList<QGesture*>>
            ((QtPrivate *)&local_60,(Stream *)&local_38,"QList",&local_50);
  QDebug::~QDebug((QDebug *)&local_38);
  QTextStream::operator<<((QTextStream *)local_60.stream,')');
  if (*(QTextStream *)(local_60.stream + 0x30) == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)local_60.stream,' ');
  }
  QDebug::~QDebug(&local_60);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,8,0x10);
    }
  }
  QDebug::~QDebug(&local_68);
  uVar1 = *(undefined8 *)gestureEvent;
  *(undefined8 *)gestureEvent = 0;
  *(undefined8 *)d.stream = uVar1;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QDebug)d.stream;
  }
  __stack_chk_fail();
}

Assistant:

Q_WIDGETS_EXPORT QDebug operator<<(QDebug d, const QGestureEvent *gestureEvent)
{
    QDebugStateSaver saver(d);
    d.nospace();
    d << "QGestureEvent(" << gestureEvent->gestures() << ')';
    return d;
}